

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

uint32 __thiscall rw::TexDictionary::streamGetSize(TexDictionary *this)

{
  Texture *pTVar1;
  uint32 uVar2;
  int iVar3;
  Texture *pTVar4;
  Texture *tex;
  LLLink *lnk;
  LLLink *_next;
  uint32 size;
  TexDictionary *this_local;
  
  _next._4_4_ = 0x10;
  tex = (Texture *)(this->textures).link.next;
  while( true ) {
    pTVar1 = (Texture *)tex->raster;
    pTVar4 = (Texture *)LinkList::end(&this->textures);
    if (tex == pTVar4) break;
    pTVar4 = Texture::fromDict((LLLink *)tex);
    uVar2 = Texture::streamGetSizeNative(pTVar4);
    iVar3 = PluginList::streamGetSize((PluginList *)&Texture::s_plglist,pTVar4);
    _next._4_4_ = iVar3 + uVar2 + 0x18 + _next._4_4_;
    tex = pTVar1;
  }
  iVar3 = PluginList::streamGetSize((PluginList *)&s_plglist,this);
  return iVar3 + 0xc + _next._4_4_;
}

Assistant:

uint32
TexDictionary::streamGetSize(void)
{
	uint32 size = 12 + 4;
	FORLIST(lnk, this->textures){
		Texture *tex = Texture::fromDict(lnk);
		size += 12 + tex->streamGetSizeNative();
		size += 12 + Texture::s_plglist.streamGetSize(tex);
	}
	size += 12 + s_plglist.streamGetSize(this);
	return size;
}